

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  BYTE *base;
  seq_t sequence;
  uint uVar5;
  int iVar6;
  BYTE *op_2;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  BYTE *pBVar12;
  BYTE *oend;
  BYTE *pBVar13;
  ulong uVar14;
  BYTE *pBVar15;
  ulong uVar16;
  BYTE *op;
  BYTE *pBVar17;
  BYTE *pBVar18;
  uint uVar19;
  BYTE *ip_1;
  size_t __n;
  bool bVar20;
  BYTE *litPtr;
  BYTE *local_128;
  BIT_DStream_t local_120;
  ZSTD_fseState local_f8;
  ZSTD_fseState local_e8;
  ZSTD_fseState local_d8;
  ulong local_c8 [6];
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *local_80;
  void *local_78;
  BYTE *local_70;
  ulong *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong local_40;
  BYTE *pBStack_38;
  
  if (dctx->bmi2 != 0) {
    sVar7 = ZSTD_decompressSequences_bmi2(dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar7;
  }
  pBVar17 = (BYTE *)(maxDstSize + (long)dst);
  local_128 = dctx->litPtr;
  pBVar18 = local_128 + dctx->litSize;
  op = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_0014f52b:
    uVar11 = (long)pBVar18 - (long)local_128;
    pBVar18 = (BYTE *)0xffffffffffffffba;
    if (uVar11 <= (ulong)((long)pBVar17 - (long)op)) {
      memcpy(op,local_128,uVar11);
      pBVar18 = op + (uVar11 - (long)dst);
    }
  }
  else {
    base = (BYTE *)dctx->prefixStart;
    local_80 = (BYTE *)dctx->virtualStart;
    local_88 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar8 = -0xc;
    do {
      *(ulong *)((long)local_c8 + lVar8 * 2 + 0x18) =
           (ulong)*(uint *)((long)dctx->workspace + lVar8);
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0);
    if (seqSize != 0) {
      local_120.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_120.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_120.bitContainer =
               local_120.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_120.bitContainer =
               local_120.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_120.bitContainer =
               local_120.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_120.bitContainer =
               local_120.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_120.bitContainer =
               local_120.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_120.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_120.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar5 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          local_120.bitsConsumed = (uVar5 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_120.ptr = (char *)seqStart;
LAB_0014eee4:
          local_120.start = (char *)seqStart;
          ZSTD_initFseState(&local_f8,&local_120,dctx->LLTptr);
          ZSTD_initFseState(&local_e8,&local_120,dctx->OFTptr);
          ZSTD_initFseState(&local_d8,&local_120,dctx->MLTptr);
          local_98 = pBVar17;
          local_70 = pBVar17 + -0xd;
          local_78 = dst;
          local_90 = pBVar17 + -8;
LAB_0014ef67:
          uVar11 = local_c8[1];
          uVar9 = (ulong)local_120.bitsConsumed;
          if (uVar9 < 0x41) {
            if (local_120.ptr < local_120.limitPtr) {
              if (local_120.ptr != local_120.start) {
                uVar5 = (int)local_120.ptr - (int)local_120.start;
                if (local_120.start <=
                    (ulong *)((long)local_120.ptr - (ulong)(local_120.bitsConsumed >> 3))) {
                  uVar5 = local_120.bitsConsumed >> 3;
                }
                local_120.bitsConsumed = local_120.bitsConsumed + uVar5 * -8;
                goto LAB_0014efc7;
              }
            }
            else {
              uVar5 = local_120.bitsConsumed >> 3;
              local_120.bitsConsumed = local_120.bitsConsumed & 7;
LAB_0014efc7:
              local_120.ptr = (char *)((long)local_120.ptr - (ulong)uVar5);
              uVar9 = (ulong)local_120.bitsConsumed;
              local_120.bitContainer = *(size_t *)local_120.ptr;
            }
            bVar20 = nbSeq != 0;
            nbSeq = nbSeq + -1;
            uVar5 = (uint)uVar9;
            if (bVar20) {
              local_68 = (ulong *)local_120.limitPtr;
              bVar1 = local_f8.table[local_f8.state].nbAdditionalBits;
              bVar2 = local_d8.table[local_d8.state].nbAdditionalBits;
              bVar3 = local_e8.table[local_e8.state].nbAdditionalBits;
              local_58 = (ulong)local_f8.table[local_f8.state].baseValue;
              local_60 = (ulong)local_d8.table[local_d8.state].baseValue;
              uVar19 = (uint)bVar3;
              if (bVar3 == 0) {
                uVar14 = 0;
LAB_0014f07c:
                lVar8 = (local_58 == 0) + uVar14;
                if (lVar8 != 0) {
                  if (lVar8 == 3) {
                    uVar14 = (local_c8[0] - 1) + (ulong)(local_c8[0] == 1);
LAB_0014f0c5:
                    local_c8[2] = local_c8[1];
                  }
                  else {
                    uVar14 = local_c8[lVar8] + (ulong)(local_c8[lVar8] == 0);
                    if (lVar8 != 1) goto LAB_0014f0c5;
                  }
                  local_c8[1] = local_c8[0];
                  goto LAB_0014f0e5;
                }
              }
              else {
                uVar14 = ((local_120.bitContainer << ((byte)uVar9 & 0x3f)) >> (-bVar3 & 0x3f)) +
                         (ulong)local_e8.table[local_e8.state].baseValue;
                uVar9 = (ulong)(uVar5 + uVar19);
                if (uVar19 == 1) goto LAB_0014f07c;
                local_c8[1] = local_c8[0];
                local_c8[2] = uVar11;
LAB_0014f0e5:
                local_c8[1] = local_c8[0];
                local_c8[0] = uVar14;
              }
              uVar11 = local_c8[0];
              if (bVar2 == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = (local_120.bitContainer << ((byte)uVar9 & 0x3f)) >> (-bVar2 & 0x3f);
                uVar9 = (ulong)((int)uVar9 + (uint)bVar2);
              }
              uVar5 = (uint)uVar9;
              if ((0x1e < (uint)bVar2 + (uint)bVar1 + uVar19) && (uVar5 < 0x41)) {
                if (local_120.ptr < local_120.limitPtr) {
                  if (local_120.ptr == local_120.start) goto LAB_0014f17d;
                  uVar16 = (ulong)(uint)((int)local_120.ptr - (int)local_120.start);
                  if (local_120.start <= (ulong *)((long)local_120.ptr - (uVar9 >> 3))) {
                    uVar16 = uVar9 >> 3;
                  }
                  uVar5 = uVar5 + (int)uVar16 * -8;
                }
                else {
                  uVar16 = uVar9 >> 3;
                  uVar5 = uVar5 & 7;
                }
                local_120.ptr = (char *)((long)local_120.ptr - uVar16);
                local_120.bitContainer = *(size_t *)local_120.ptr;
              }
LAB_0014f17d:
              if (bVar1 == 0) {
                local_50 = 0;
              }
              else {
                local_50 = (local_120.bitContainer << ((byte)uVar5 & 0x3f)) >> (-bVar1 & 0x3f);
                uVar5 = uVar5 + bVar1;
              }
              __n = uVar14 + local_d8.table[local_d8.state].baseValue;
              iVar6 = uVar5 + local_f8.table[local_f8.state].nbBits;
              local_50 = local_50 + local_58;
              local_f8.state =
                   (ulong)((uint)(local_120.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                          BIT_mask[local_f8.table[local_f8.state].nbBits]) +
                   (ulong)local_f8.table[local_f8.state].nextState;
              iVar6 = iVar6 + (uint)local_d8.table[local_d8.state].nbBits;
              local_d8.state =
                   (ulong)((uint)(local_120.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                          BIT_mask[local_d8.table[local_d8.state].nbBits]) +
                   (ulong)local_d8.table[local_d8.state].nextState;
              local_120.bitsConsumed = iVar6 + (uint)local_e8.table[local_e8.state].nbBits;
              local_e8.state =
                   (ulong)((uint)(local_120.bitContainer >> (-(char)local_120.bitsConsumed & 0x3fU))
                          & BIT_mask[local_e8.table[local_e8.state].nbBits]) +
                   (ulong)local_e8.table[local_e8.state].nextState;
              sStack_48 = __n;
              local_40 = local_c8[0];
              uVar9 = local_50 + __n;
              pBVar17 = op + uVar9;
              if (local_98 < pBVar17) {
                return 0xffffffffffffffba;
              }
              pBVar10 = local_128 + local_50;
              if (pBVar18 < pBVar10) {
                return 0xffffffffffffffec;
              }
              pBVar13 = op + local_50;
              if (local_90 < pBVar13) {
                sequence.matchLength = __n;
                sequence.litLength = local_50;
                sequence.offset = local_c8[0];
                sequence.match = pBStack_38;
                uVar9 = ZSTD_execSequenceLast7
                                  (op,local_98,sequence,&local_128,pBVar18,base,local_80,local_88);
              }
              else {
                *(undefined8 *)op = *(undefined8 *)local_128;
                if (8 < local_50) {
                  pBVar15 = op + 8;
                  do {
                    local_128 = local_128 + 8;
                    *(undefined8 *)pBVar15 = *(undefined8 *)local_128;
                    pBVar15 = pBVar15 + 8;
                  } while (pBVar15 < pBVar13);
                }
                pBVar15 = pBVar13 + -local_c8[0];
                local_128 = pBVar10;
                if ((ulong)((long)pBVar13 - (long)base) < local_c8[0]) {
                  if ((ulong)((long)pBVar13 - (long)local_80) < local_c8[0]) {
                    return 0xffffffffffffffec;
                  }
                  lVar8 = (long)(pBVar13 + -local_c8[0]) - (long)base;
                  pBVar10 = local_88 + lVar8;
                  if (local_88 < pBVar10 + __n) {
                    memmove(pBVar13,pBVar10,-lVar8);
                    pBVar13 = pBVar13 + -lVar8;
                    sStack_48 = __n + lVar8;
                    if ((pBVar13 <= local_90) && (pBVar15 = base, 2 < sStack_48)) goto LAB_0014f3a2;
                    if (sStack_48 != 0) {
                      uVar11 = 0;
                      do {
                        pBVar13[uVar11] = base[uVar11];
                        uVar11 = uVar11 + 1;
                      } while ((uVar11 & 0xffffffff) < sStack_48);
                    }
                  }
                  else {
                    memmove(pBVar13,pBVar10,__n);
                  }
                }
                else {
LAB_0014f3a2:
                  if (uVar11 < 8) {
                    iVar6 = *(int *)(ZSTD_execSequence_dec64table + uVar11 * 4);
                    *pBVar13 = *pBVar15;
                    pBVar13[1] = pBVar15[1];
                    pBVar13[2] = pBVar15[2];
                    pBVar13[3] = pBVar15[3];
                    pBVar10 = pBVar15 + *(uint *)(ZSTD_execSequence_dec32table + local_40 * 4);
                    pBVar15 = pBVar15 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table +
                                                         local_40 * 4) - (long)iVar6);
                    *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)pBVar10;
                  }
                  else {
                    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar15;
                  }
                  pBVar10 = pBVar13 + 8;
                  pBVar15 = pBVar15 + 8;
                  if (local_70 < pBVar17) {
                    pBVar13 = pBVar10;
                    pBVar12 = pBVar15;
                    if (pBVar10 < local_90) {
                      do {
                        *(undefined8 *)pBVar13 = *(undefined8 *)pBVar12;
                        pBVar13 = pBVar13 + 8;
                        pBVar12 = pBVar12 + 8;
                      } while (pBVar13 < local_90);
                      pBVar15 = pBVar15 + ((long)local_90 - (long)pBVar10);
                      pBVar10 = local_90;
                    }
                    for (; pBVar10 < pBVar17; pBVar10 = pBVar10 + 1) {
                      BVar4 = *pBVar15;
                      pBVar15 = pBVar15 + 1;
                      *pBVar10 = BVar4;
                    }
                  }
                  else {
                    do {
                      *(undefined8 *)pBVar10 = *(undefined8 *)pBVar15;
                      pBVar10 = pBVar10 + 8;
                      pBVar15 = pBVar15 + 8;
                    } while (pBVar10 < pBVar13 + sStack_48);
                  }
                }
              }
              op = op + uVar9;
              if (0xffffffffffffff88 < uVar9) {
                return uVar9;
              }
              goto LAB_0014ef67;
            }
            if (uVar5 < 0x41) {
              if ((uVar5 == 0x40) && (local_120.ptr < local_120.limitPtr)) {
                if (local_120.ptr != local_120.start) {
                  return 0xffffffffffffffec;
                }
                goto LAB_0014f4fc;
              }
              goto LAB_0014f556;
            }
          }
          else if (nbSeq != 0) {
            return 0xffffffffffffffec;
          }
LAB_0014f4fc:
          lVar8 = 0;
          do {
            (dctx->entropy).rep[lVar8] = (U32)local_c8[lVar8];
            lVar8 = lVar8 + 1;
            dst = local_78;
            pBVar17 = local_98;
          } while (lVar8 != 3);
          goto LAB_0014f52b;
        }
      }
      else {
        local_120.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_120.bitContainer = *(size_t *)local_120.ptr;
        if (local_120.bitContainer >> 0x38 != 0) {
          uVar5 = 0x1f;
          bVar1 = (byte)(local_120.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          local_120.bitsConsumed = ~uVar5 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_0014eee4;
        }
      }
    }
LAB_0014f556:
    pBVar18 = (BYTE *)0xffffffffffffffec;
  }
  return (size_t)pBVar18;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}